

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  int iVar1;
  ImFont **__src;
  ImFontConfig *pIVar2;
  ImFont *pIVar3;
  ImFont **__dest;
  ImFontConfig *__dest_00;
  void *__dest_01;
  int iVar4;
  long lVar5;
  int iVar6;
  
  if (this->Locked == true) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x734,"AddFont","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x735,"AddFont","ImGui ASSERT FAILED: %s",
                "font_cfg->FontData != NULL && font_cfg->FontDataSize > 0");
  }
  if (font_cfg->SizePixels <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x736,"AddFont","ImGui ASSERT FAILED: %s","font_cfg->SizePixels > 0.0f");
  }
  if (font_cfg->MergeMode == false) {
    pIVar3 = (ImFont *)ImGui::MemAlloc(0x78);
    (pIVar3->IndexAdvanceX).Size = 0;
    (pIVar3->IndexAdvanceX).Capacity = 0;
    (pIVar3->IndexAdvanceX).Data = (float *)0x0;
    pIVar3->FallbackAdvanceX = 0.0;
    pIVar3->FontSize = 0.0;
    (pIVar3->IndexLookup).Size = 0;
    (pIVar3->IndexLookup).Capacity = 0;
    (pIVar3->IndexLookup).Data = (unsigned_short *)0x0;
    (pIVar3->Glyphs).Size = 0;
    (pIVar3->Glyphs).Capacity = 0;
    (pIVar3->Glyphs).Data = (ImFontGlyph *)0x0;
    pIVar3->EllipsisChar = 0xffff;
    pIVar3->DirtyLookupTables = false;
    pIVar3->FallbackGlyph = (ImFontGlyph *)0x0;
    (pIVar3->DisplayOffset).x = 0.0;
    (pIVar3->DisplayOffset).y = 0.0;
    pIVar3->ContainerAtlas = (ImFontAtlas *)0x0;
    pIVar3->ConfigData = (ImFontConfig *)0x0;
    pIVar3->ConfigDataCount = 0;
    pIVar3->FallbackChar = 0x3f;
    pIVar3->Scale = 1.0;
    pIVar3->Ascent = 0.0;
    pIVar3->Descent = 0.0;
    *(undefined8 *)((long)&pIVar3->Descent + 2) = 0;
    iVar6 = (this->Fonts).Size;
    iVar1 = (this->Fonts).Capacity;
    if (iVar6 == iVar1) {
      iVar6 = iVar6 + 1;
      if (iVar1 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar1 / 2 + iVar1;
      }
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar1 < iVar6) {
        __dest = (ImFont **)ImGui::MemAlloc((long)iVar6 << 3);
        __src = (this->Fonts).Data;
        if (__src != (ImFont **)0x0) {
          memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
          ImGui::MemFree((this->Fonts).Data);
        }
        (this->Fonts).Data = __dest;
        (this->Fonts).Capacity = iVar6;
      }
    }
    (this->Fonts).Data[(this->Fonts).Size] = pIVar3;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  else if ((this->Fonts).Size == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x73c,"AddFont","ImGui ASSERT FAILED: %s",
                "!Fonts.empty() && \"Cannot use MergeMode for the first font\"");
  }
  iVar6 = (this->ConfigData).Size;
  iVar1 = (this->ConfigData).Capacity;
  if (iVar6 == iVar1) {
    iVar6 = iVar6 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar6 < iVar4) {
      iVar6 = iVar4;
    }
    if (iVar1 < iVar6) {
      __dest_00 = (ImFontConfig *)ImGui::MemAlloc((long)iVar6 * 0x88);
      pIVar2 = (this->ConfigData).Data;
      if (pIVar2 != (ImFontConfig *)0x0) {
        memcpy(__dest_00,pIVar2,(long)(this->ConfigData).Size * 0x88);
        ImGui::MemFree((this->ConfigData).Data);
      }
      (this->ConfigData).Data = __dest_00;
      (this->ConfigData).Capacity = iVar6;
    }
  }
  memcpy((this->ConfigData).Data + (this->ConfigData).Size,font_cfg,0x88);
  iVar6 = (this->ConfigData).Size;
  (this->ConfigData).Size = iVar6 + 1;
  if (iVar6 < 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
  }
  pIVar2 = (this->ConfigData).Data;
  lVar5 = (long)(this->ConfigData).Size;
  if (pIVar2[lVar5 + -1].DstFont == (ImFont *)0x0) {
    if ((this->Fonts).Size < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    }
    pIVar2[lVar5 + -1].DstFont = (this->Fonts).Data[(long)(this->Fonts).Size + -1];
  }
  if (pIVar2[lVar5 + -1].FontDataOwnedByAtlas == false) {
    __dest_01 = ImGui::MemAlloc((long)pIVar2[lVar5 + -1].FontDataSize);
    pIVar2[lVar5 + -1].FontData = __dest_01;
    pIVar2[lVar5 + -1].FontDataOwnedByAtlas = true;
    memcpy(__dest_01,font_cfg->FontData,(long)pIVar2[lVar5 + -1].FontDataSize);
  }
  if ((pIVar2[lVar5 + -1].DstFont)->EllipsisChar == 0xffff) {
    (pIVar2[lVar5 + -1].DstFont)->EllipsisChar = font_cfg->EllipsisChar;
  }
  ClearTexData(this);
  return pIVar2[lVar5 + -1].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}